

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::reserve(vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
          *this,size_t n)

{
  uchar uVar1;
  memory_resource *pmVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  ulong uVar6;
  optional<std::pair<int,_int>_> *poVar7;
  optional<std::pair<int,_int>_> *poVar4;
  
  if (n <= this->nAlloc) {
    return;
  }
  if (n * 0xc == 0) {
    poVar4 = (optional<std::pair<int,_int>_> *)0x0;
  }
  else {
    pmVar2 = (this->alloc).memoryResource;
    iVar3 = (*pmVar2->_vptr_memory_resource[2])(pmVar2,n * 0xc,4);
    poVar4 = (optional<std::pair<int,_int>_> *)CONCAT44(extraout_var,iVar3);
  }
  poVar7 = this->ptr;
  if (this->nStored == 0) {
    if (poVar7 == (optional<std::pair<int,_int>_> *)0x0) goto LAB_0029339e;
  }
  else {
    lVar5 = 8;
    uVar6 = 0;
    do {
      uVar1 = (poVar7->optionalValue).__data[lVar5];
      (poVar4->optionalValue).__data[lVar5] = uVar1;
      if ((uVar1 == '\x01') &&
         (*(undefined8 *)((long)poVar4 + lVar5 + -8) = *(undefined8 *)((long)poVar7 + lVar5 + -8),
         (poVar7->optionalValue).__data[lVar5] == '\x01')) {
        (poVar7->optionalValue).__data[lVar5] = '\0';
      }
      poVar7 = this->ptr;
      if ((poVar7->optionalValue).__data[lVar5] == '\x01') {
        (poVar7->optionalValue).__data[lVar5] = '\0';
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0xc;
    } while (uVar6 < this->nStored);
  }
  pmVar2 = (this->alloc).memoryResource;
  (*pmVar2->_vptr_memory_resource[3])(pmVar2,poVar7,this->nAlloc * 0xc,4);
LAB_0029339e:
  this->nAlloc = n;
  this->ptr = poVar4;
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }